

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_acoustics.c
# Opt level: O2

t_float dbtopow(t_float f)

{
  double dVar1;
  t_float tVar2;
  float fVar3;
  
  tVar2 = 0.0;
  if (0.0 < f) {
    fVar3 = 870.0;
    if (f <= 870.0) {
      fVar3 = f;
    }
    dVar1 = exp(((double)fVar3 + -100.0) * 0.2302585092994046);
    tVar2 = (t_float)dVar1;
  }
  return tVar2;
}

Assistant:

t_float dbtopow(t_float f)
{
    if (f <= 0)
        return(0);
    else
    {
        if (f > 870)
            f = 870;
        return (exp((LOGTEN * 0.1) * (f-100.)));
    }
}